

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOLayoutTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::anon_unknown_1::BlockMultiBasicTypesCase::init
          (BlockMultiBasicTypesCase *this,EVP_PKEY_CTX *ctx)

{
  vector<deqp::gles31::bb::BufferVar,_std::allocator<deqp::gles31::bb::BufferVar>_> *pvVar1;
  ShaderInterface *this_00;
  deUint32 extraout_EAX;
  deUint32 dVar2;
  BufferBlock *this_01;
  BufferBlock *this_02;
  VarType local_80;
  BufferVar local_68;
  
  this_00 = &(this->super_SSBOLayoutCase).m_interface;
  this_01 = bb::ShaderInterface::allocBlock(this_00,"BlockA");
  glu::VarType::VarType(&local_80,TYPE_FLOAT,PRECISION_HIGHP);
  bb::BufferVar::BufferVar(&local_68,"a",&local_80,0x1800);
  pvVar1 = &this_01->m_variables;
  std::vector<deqp::gles31::bb::BufferVar,_std::allocator<deqp::gles31::bb::BufferVar>_>::push_back
            (pvVar1,&local_68);
  bb::BufferVar::~BufferVar(&local_68);
  glu::VarType::~VarType(&local_80);
  glu::VarType::VarType(&local_80,TYPE_UINT_VEC3,PRECISION_LOWP);
  bb::BufferVar::BufferVar(&local_68,"b",&local_80,0);
  std::vector<deqp::gles31::bb::BufferVar,_std::allocator<deqp::gles31::bb::BufferVar>_>::push_back
            (pvVar1,&local_68);
  bb::BufferVar::~BufferVar(&local_68);
  glu::VarType::~VarType(&local_80);
  glu::VarType::VarType(&local_80,TYPE_FLOAT_MAT2,PRECISION_MEDIUMP);
  bb::BufferVar::BufferVar(&local_68,"c",&local_80,0x800);
  std::vector<deqp::gles31::bb::BufferVar,_std::allocator<deqp::gles31::bb::BufferVar>_>::push_back
            (pvVar1,&local_68);
  bb::BufferVar::~BufferVar(&local_68);
  glu::VarType::~VarType(&local_80);
  std::__cxx11::string::assign((char *)&this_01->m_instanceName);
  this_01->m_flags = this->m_flagsA;
  this_02 = bb::ShaderInterface::allocBlock(this_00,"BlockB");
  glu::VarType::VarType(&local_80,TYPE_FLOAT_MAT3,PRECISION_MEDIUMP);
  bb::BufferVar::BufferVar(&local_68,"a",&local_80,0x1000);
  pvVar1 = &this_02->m_variables;
  std::vector<deqp::gles31::bb::BufferVar,_std::allocator<deqp::gles31::bb::BufferVar>_>::push_back
            (pvVar1,&local_68);
  bb::BufferVar::~BufferVar(&local_68);
  glu::VarType::~VarType(&local_80);
  glu::VarType::VarType(&local_80,TYPE_INT_VEC2,PRECISION_LOWP);
  bb::BufferVar::BufferVar(&local_68,"b",&local_80,0x800);
  std::vector<deqp::gles31::bb::BufferVar,_std::allocator<deqp::gles31::bb::BufferVar>_>::push_back
            (pvVar1,&local_68);
  bb::BufferVar::~BufferVar(&local_68);
  glu::VarType::~VarType(&local_80);
  glu::VarType::VarType(&local_80,TYPE_FLOAT_VEC4,PRECISION_HIGHP);
  bb::BufferVar::BufferVar(&local_68,"c",&local_80,0);
  std::vector<deqp::gles31::bb::BufferVar,_std::allocator<deqp::gles31::bb::BufferVar>_>::push_back
            (pvVar1,&local_68);
  bb::BufferVar::~BufferVar(&local_68);
  glu::VarType::~VarType(&local_80);
  glu::VarType::VarType(&local_80,TYPE_BOOL,PRECISION_LAST);
  bb::BufferVar::BufferVar(&local_68,"d",&local_80,0x1800);
  std::vector<deqp::gles31::bb::BufferVar,_std::allocator<deqp::gles31::bb::BufferVar>_>::push_back
            (pvVar1,&local_68);
  bb::BufferVar::~BufferVar(&local_68);
  glu::VarType::~VarType(&local_80);
  std::__cxx11::string::assign((char *)&this_02->m_instanceName);
  dVar2 = this->m_flagsB;
  this_02->m_flags = dVar2;
  if (0 < this->m_numInstances) {
    bb::BufferBlock::setArraySize(this_01,this->m_numInstances);
    bb::BufferBlock::setArraySize(this_02,this->m_numInstances);
    dVar2 = extraout_EAX;
  }
  return dVar2;
}

Assistant:

void init (void)
	{
		BufferBlock& blockA = m_interface.allocBlock("BlockA");
		blockA.addMember(BufferVar("a", VarType(glu::TYPE_FLOAT, glu::PRECISION_HIGHP), ACCESS_READ|ACCESS_WRITE));
		blockA.addMember(BufferVar("b", VarType(glu::TYPE_UINT_VEC3, glu::PRECISION_LOWP), 0 /* no access */));
		blockA.addMember(BufferVar("c", VarType(glu::TYPE_FLOAT_MAT2, glu::PRECISION_MEDIUMP), ACCESS_READ));
		blockA.setInstanceName("blockA");
		blockA.setFlags(m_flagsA);

		BufferBlock& blockB = m_interface.allocBlock("BlockB");
		blockB.addMember(BufferVar("a", VarType(glu::TYPE_FLOAT_MAT3, glu::PRECISION_MEDIUMP), ACCESS_WRITE));
		blockB.addMember(BufferVar("b", VarType(glu::TYPE_INT_VEC2, glu::PRECISION_LOWP), ACCESS_READ));
		blockB.addMember(BufferVar("c", VarType(glu::TYPE_FLOAT_VEC4, glu::PRECISION_HIGHP), 0 /* no access */));
		blockB.addMember(BufferVar("d", VarType(glu::TYPE_BOOL, glu::PRECISION_LAST), ACCESS_READ|ACCESS_WRITE));
		blockB.setInstanceName("blockB");
		blockB.setFlags(m_flagsB);

		if (m_numInstances > 0)
		{
			blockA.setArraySize(m_numInstances);
			blockB.setArraySize(m_numInstances);
		}
	}